

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_BigTree_Test::TestBody(SCCTest_BigTree_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_02;
  bool bVar1;
  char *message;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_210;
  AssertHelper local_1c8;
  Message local_1c0;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_1b1;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_1b0;
  undefined1 local_1af;
  allocator<unsigned_int> local_1ae;
  less<unsigned_int> local_1ad;
  uint local_1ac [3];
  iterator local_1a0;
  size_type local_198;
  allocator<unsigned_int> local_18e;
  less<unsigned_int> local_18d;
  uint local_18c [3];
  iterator local_180;
  size_type local_178;
  allocator<unsigned_int> local_16e;
  less<unsigned_int> local_16d;
  uint local_16c [3];
  iterator local_160;
  size_type local_158;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_150;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_148;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_118;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_e8;
  iterator local_b8;
  size_type local_b0;
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  SCCSet local_78;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Graph_conflict1 graph;
  SCCTest_BigTree_Test *this_local;
  
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Graph::Graph((Graph *)local_28,9);
  Graph::addEdge((Graph *)local_28,0,1);
  Graph::addEdge((Graph *)local_28,1,2);
  Graph::addEdge((Graph *)local_28,2,0);
  Graph::addEdge((Graph *)local_28,3,4);
  Graph::addEdge((Graph *)local_28,4,5);
  Graph::addEdge((Graph *)local_28,5,3);
  Graph::addEdge((Graph *)local_28,6,7);
  Graph::addEdge((Graph *)local_28,7,8);
  Graph::addEdge((Graph *)local_28,8,6);
  Graph::addEdge((Graph *)local_28,3,2);
  Graph::addEdge((Graph *)local_28,5,6);
  getSCCs(&local_78,(Graph_conflict1 *)local_28);
  local_1af = 1;
  local_16c[0] = 0;
  local_16c[1] = 1;
  local_16c[2] = 2;
  local_160 = local_16c;
  local_158 = 3;
  local_150 = &local_148;
  std::allocator<unsigned_int>::allocator(&local_16e);
  __l_01._M_len = local_158;
  __l_01._M_array = local_160;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_148,__l_01,&local_16d,&local_16e);
  local_18c[0] = 3;
  local_18c[1] = 4;
  local_18c[2] = 5;
  local_180 = local_18c;
  local_178 = 3;
  local_150 = &local_118;
  std::allocator<unsigned_int>::allocator(&local_18e);
  __l_00._M_len = local_178;
  __l_00._M_array = local_180;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_118,__l_00,&local_18d,&local_18e);
  local_1ac[0] = 6;
  local_1ac[1] = 7;
  local_1ac[2] = 8;
  local_1a0 = local_1ac;
  local_198 = 3;
  local_150 = &local_e8;
  std::allocator<unsigned_int>::allocator(&local_1ae);
  __l._M_len = local_198;
  __l._M_array = local_1a0;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_e8,__l,&local_1ad,&local_1ae);
  local_1af = 0;
  local_b8 = &local_148;
  local_b0 = 3;
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  allocator(&local_1b1);
  __l_02._M_len = local_b0;
  __l_02._M_array = local_b8;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set(&local_a8,__l_02,&local_1b0,&local_1b1);
  testing::internal::EqHelper::
  Compare<std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_48,"getSCCs(graph)","(SCCSet{{0, 1, 2}, {3, 4, 5}, {6, 7, 8}})",
             &local_78,&local_a8);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_a8);
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  ~allocator(&local_1b1);
  local_210 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_b8
  ;
  do {
    local_210 = local_210 + -1;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(local_210);
  } while (local_210 != &local_148);
  std::allocator<unsigned_int>::~allocator(&local_1ae);
  std::allocator<unsigned_int>::~allocator(&local_18e);
  std::allocator<unsigned_int>::~allocator(&local_16e);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0x11f,message);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Graph::~Graph((Graph *)local_28);
  return;
}

Assistant:

TEST(SCCTest, BigTree) {
  // 012 <- 345 -> 678
  Graph graph(9);
  graph.addEdge(0, 1);
  graph.addEdge(1, 2);
  graph.addEdge(2, 0);

  graph.addEdge(3, 4);
  graph.addEdge(4, 5);
  graph.addEdge(5, 3);

  graph.addEdge(6, 7);
  graph.addEdge(7, 8);
  graph.addEdge(8, 6);

  graph.addEdge(3, 2);
  graph.addEdge(5, 6);

  EXPECT_EQ(getSCCs(graph), (SCCSet{{0, 1, 2}, {3, 4, 5}, {6, 7, 8}}));
}